

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O1

char * add_file_name_to_url(CURL *curl,char *url,char *filename)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  
  pcVar1 = strstr(url,"://");
  pcVar6 = pcVar1 + 3;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = url;
  }
  pcVar1 = strrchr(pcVar6,0x2f);
  pcVar6 = url;
  if ((pcVar1 == (char *)0x0) || (pcVar1[1] == '\0')) {
    pcVar2 = strrchr(filename,0x2f);
    pcVar7 = pcVar2 + 1;
    if (pcVar2 == (char *)0x0) {
      pcVar7 = filename;
      pcVar2 = filename;
    }
    pcVar3 = strrchr(pcVar2,0x5c);
    pcVar2 = pcVar3 + 1;
    if (pcVar3 == (char *)0x0) {
      pcVar2 = pcVar7;
    }
    pcVar2 = (char *)curl_easy_escape(curl,pcVar2,0);
    if (pcVar2 != (char *)0x0) {
      sVar4 = strlen(url);
      sVar5 = strlen(pcVar2);
      pcVar6 = (char *)malloc(sVar4 + sVar5 + 3);
      if (pcVar6 == (char *)0x0) {
        curl_free(pcVar2);
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar7 = "%s%s";
        if (pcVar1 == (char *)0x0) {
          pcVar7 = "%s/%s";
        }
        curl_msprintf(pcVar6,pcVar7,url,pcVar2);
        curl_free(pcVar2);
      }
      if (url != (char *)0x0) {
        free(url);
      }
    }
  }
  return pcVar6;
}

Assistant:

char *add_file_name_to_url(CURL *curl, char *url, const char *filename)
{
  /* If no file name part is given in the URL, we add this file name */
  char *ptr = strstr(url, "://");
  if(ptr)
    ptr += 3;
  else
    ptr = url;
  ptr = strrchr(ptr, '/');
  if(!ptr || !strlen(++ptr)) {
    /* The URL has no file name part, add the local file name. In order
       to be able to do so, we have to create a new URL in another
       buffer.*/

    /* We only want the part of the local path that is on the right
       side of the rightmost slash and backslash. */
    const char *filep = strrchr(filename, '/');
    char *file2 = strrchr(filep?filep:filename, '\\');
    char *encfile;

    if(file2)
      filep = file2 + 1;
    else if(filep)
      filep++;
    else
      filep = filename;

    /* URL encode the file name */
    encfile = curl_easy_escape(curl, filep, 0 /* use strlen */);
    if(encfile) {
      char *urlbuffer = malloc(strlen(url) + strlen(encfile) + 3);
      if(!urlbuffer) {
        curl_free(encfile);
        Curl_safefree(url);
        return NULL;
      }
      if(ptr)
        /* there is a trailing slash on the URL */
        sprintf(urlbuffer, "%s%s", url, encfile);
      else
        /* there is no trailing slash on the URL */
        sprintf(urlbuffer, "%s/%s", url, encfile);

      curl_free(encfile);
      Curl_safefree(url);

      url = urlbuffer; /* use our new URL instead! */
    }
  }
  return url;
}